

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CRange::process(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *__return_storage_ptr__,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *commands,short sswitch,
                 vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *targets)

{
  pointer *ppRVar1;
  double dVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  pointer pbVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long local_450;
  istringstream c;
  byte abStack_430 [88];
  ios_base local_3d8 [264];
  long local_2d0;
  ostringstream r;
  uint auStack_2b8 [22];
  ios_base local_260 [264];
  undefined1 local_158 [8];
  Tdata target;
  undefined1 auStack_b8 [8];
  vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> rt;
  string task;
  string targname;
  double red2;
  double a1;
  double local_48;
  double red1;
  double z1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar6 = (commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((commands->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar6) {
    auStack_b8 = (undefined1  [8])0x0;
    rt.super__Vector_base<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rt.super__Vector_base<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    target._hash = (double)commands;
    if (pbVar6 != (commands->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_450,(string *)pbVar6,_S_in);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
        rt.super__Vector_base<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&task._M_string_length;
        task._M_dataplus._M_p = (pointer)0x0;
        task._M_string_length._0_1_ = 0;
        task.field_2._8_8_ = &targname._M_string_length;
        targname._M_dataplus._M_p = (pointer)0x0;
        targname._M_string_length._0_1_ = 0;
        piVar4 = std::operator>>((istream *)&local_450,
                                 (string *)
                                 &rt.
                                  super__Vector_base<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        std::operator>>(piVar4,(string *)(task.field_2._M_local_buf + 8));
        if ((abStack_430[*(long *)(local_450 + -0x18)] & 2) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Invalid command detected: ",0x1a);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(pbVar6->_M_dataplus)._M_p,
                              pbVar6->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          uVar7 = 0;
          uVar8 = 0xc0c38780;
        }
        else {
          find_target((Tdata *)local_158,(string *)((long)&task.field_2 + 8),targets);
          iVar3 = std::__cxx11::string::compare((char *)local_158);
          if (iVar3 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid target detected in command: ",0x24);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(pbVar6->_M_dataplus)._M_p,
                                pbVar6->_M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_0010a35b:
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            uVar7 = 0;
            uVar8 = 0xc0c38780;
          }
          else {
            ppRVar1 = &rt.
                       super__Vector_base<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar3 = std::__cxx11::string::compare((char *)ppRVar1);
            if (iVar3 == 0) {
              dVar2 = range(local_48,red1,red2,sswitch,(Tdata *)local_158,
                            (vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)
                            auStack_b8);
              uVar7 = SUB84(dVar2,0);
              uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)ppRVar1);
              if (iVar3 == 0) {
                dVar2 = renergy(local_48,(double)targname.field_2._8_8_,red1,red2,sswitch,
                                (Tdata *)local_158,
                                (vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)
                                auStack_b8);
                uVar7 = SUB84(dVar2,0);
                uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)ppRVar1);
                if (iVar3 == 0) {
                  dVar2 = dedx(local_48,(double)targname.field_2._8_8_,red1,red2,sswitch,
                               (Tdata *)local_158);
                  uVar7 = SUB84(dVar2,0);
                  uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)ppRVar1);
                  if (iVar3 != 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Invalid task detected in command: ",0x22);
                    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cerr,(pbVar6->_M_dataplus)._M_p,
                                        pbVar6->_M_string_length);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                    goto LAB_0010a35b;
                  }
                  dVar2 = djdx(local_48,red1,2.0,0.05,3.04,sswitch,(Tdata *)local_158);
                  uVar7 = SUB84(dVar2,0);
                  uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
                }
              }
            }
          }
          if (local_158 != (undefined1  [8])&target._name._M_string_length) {
            operator_delete((void *)local_158);
          }
        }
        *(undefined8 *)(&r + *(long *)(local_2d0 + -0x18)) = 6;
        *(uint *)((long)auStack_2b8 + *(long *)(local_2d0 + -0x18)) =
             *(uint *)((long)auStack_2b8 + *(long *)(local_2d0 + -0x18)) & 0xfffffefb | 4;
        std::ostream::_M_insert<double>((double)CONCAT44(uVar8,uVar7));
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
        if (local_158 != (undefined1  [8])&target._name._M_string_length) {
          operator_delete((void *)local_158);
        }
        if ((size_type *)task.field_2._8_8_ != &targname._M_string_length) {
          operator_delete((void *)task.field_2._8_8_);
        }
        if (rt.super__Vector_base<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)&task._M_string_length) {
          operator_delete(rt.
                          super__Vector_base<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
        std::ios_base::~ios_base(local_260);
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_450);
        std::ios_base::~ios_base(local_3d8);
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != *(pointer *)((long)target._hash + 8));
    }
    std::vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>::~vector
              ((vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)auStack_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> CRange::process( std::vector<std::string> &commands, short sswitch, std::vector<CRange::Tdata> &targets )
{
    std::vector<std::string> results;
    if (commands.size() == 0) return results;
    std::vector<CRange::RangeTable> rt;
    for (std::vector<std::string>::iterator it=commands.begin(); it != commands.end(); ++it) {
        std::istringstream c(*it);
        std::ostringstream r;
        std::string task, targname;
        double red1, red2, z1, a1;
        double out = -9999.0;
        c >> task >> red1 >> red2 >> z1 >> a1 >> targname;
        //
        // c.good() will be false, even on a good read, because a good read
        // will also reach the end of input, so we test eof instead.
        //
        if (c.eof()) {
            CRange::Tdata target = CRange::find_target(targname, targets);
            if (target.name() == "Unknown") {
                std::cerr << "Invalid target detected in command: " << *it << std::endl;
            } else {
                if (task == "r") {
                    out = CRange::range(red1,z1,a1,sswitch,target,rt);
                } else if (task == "e") {
                    out = CRange::renergy(red1,red2,z1,a1,sswitch,target,rt);
                } else if (task == "d") {
                    out = CRange::dedx(red1,red2,z1,a1,sswitch,target);
                } else if (task == "j") {
                    out = CRange::djdx(red1, z1, 2.0, 0.05, 3.04, sswitch, target);
                } else {
                    std::cerr << "Invalid task detected in command: " << *it << std::endl;
                }
            }
        } else {
            std::cerr << "Invalid command detected: " << *it << std::endl;
        }
        r << std::setprecision(6) << std::fixed << out;
        // r << std::setprecision(5) << std::scientific << out;
        results.push_back(r.str());
    }
    return results;
}